

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O1

void __thiscall
flatbuffers::ts::TsGenerator::GenStructBody
          (TsGenerator *this,StructDef *struct_def,string *body,string *nameprefix)

{
  BaseType BVar1;
  FieldDef *pFVar2;
  StructDef *pSVar3;
  size_type sVar4;
  pointer pcVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  long *plVar10;
  pointer ppFVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  string class_name;
  string fname;
  string str_last_item_idx;
  string pack_func_create_call;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_1f8;
  string local_1d8;
  string *local_1b8;
  string local_1b0;
  _Alloc_hider local_190;
  undefined4 uStack_188;
  undefined4 uStack_184;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  TsGenerator *local_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string *local_128;
  StructDef *local_120;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  string local_78;
  IdlNamer *local_58;
  string local_50;
  
  local_1b8 = body;
  local_150 = this;
  local_128 = nameprefix;
  std::__cxx11::string::append((char *)body);
  local_120 = struct_def;
  NumToString<unsigned_long>(&local_1d8,struct_def->minalign);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  paVar12 = &local_1b0.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1b0.field_2._M_allocated_capacity = *psVar9;
    local_1b0.field_2._8_8_ = plVar7[3];
    local_1b0._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar9;
    local_1b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar12) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  NumToString<unsigned_long>(&local_1d8,local_120->bytesize);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1b0.field_2._M_allocated_capacity = *psVar9;
    local_1b0.field_2._8_8_ = plVar7[3];
    local_1b0._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar9;
    local_1b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar12) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  ppFVar11 = (local_120->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar11 !=
      (local_120->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_58 = &local_150->namer_;
    do {
      paVar12 = &local_1d8.field_2;
      pFVar2 = ppFVar11[-1];
      if (pFVar2->padding != 0) {
        NumToString<unsigned_long>(&local_1f8,pFVar2->padding);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x376a36);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1d8.field_2._M_allocated_capacity = *psVar9;
          local_1d8.field_2._8_8_ = plVar7[3];
          local_1d8._M_dataplus._M_p = (pointer)paVar12;
        }
        else {
          local_1d8.field_2._M_allocated_capacity = *psVar9;
          local_1d8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1d8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d8);
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_1b0.field_2._M_allocated_capacity = *psVar9;
          local_1b0.field_2._8_8_ = plVar7[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar9;
          local_1b0._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1b0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar12) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      BVar1 = (pFVar2->value).type.base_type;
      if ((BVar1 == BASE_TYPE_STRUCT) && (((pFVar2->value).type.struct_def)->fixed == true)) {
        pSVar3 = (pFVar2->value).type.struct_def;
        sVar4 = local_128->_M_string_length;
        if (sVar4 == 0) {
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,pcVar5,
                     pcVar5 + (pFVar2->super_Definition).name._M_string_length);
        }
        else {
          local_b8[0] = &local_a8;
          pcVar5 = (local_128->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)local_b8,pcVar5,pcVar5 + sVar4);
          std::__cxx11::string::append((char *)local_b8);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_b8,
                                      (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_1b0.field_2._M_allocated_capacity = *psVar9;
            local_1b0.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar9;
            local_1b0._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1b0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
        }
        GenStructBody(local_150,pSVar3,local_1b8,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((sVar4 != 0) &&
           (uVar13 = local_a8._M_allocated_capacity, _Var14._M_p = (pointer)local_b8[0],
           local_b8[0] != &local_a8)) {
LAB_00264fd8:
          operator_delete(_Var14._M_p,uVar13 + 1);
        }
      }
      else {
        if (BVar1 == BASE_TYPE_ARRAY) {
          BVar1 = (pFVar2->value).type.element;
          if (BVar1 == BASE_TYPE_STRUCT) {
            NumToString<int>(&local_1b0,(pFVar2->value).type.fixed_length - 1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_190,"\n  for (let i = ",&local_1b0);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1f8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8.field_2._8_8_ = plVar7[3];
              local_1d8._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1d8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1d8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != paVar12) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_p != &aStack_180) {
              operator_delete(local_190._M_p,
                              CONCAT44(aStack_180._M_allocated_capacity._4_4_,
                                       CONCAT22(aStack_180._M_allocated_capacity._2_2_,
                                                aStack_180._M_allocated_capacity._0_2_)) + 1);
            }
            sVar4 = local_128->_M_string_length;
            if (sVar4 == 0) {
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,pcVar5,
                         pcVar5 + (pFVar2->super_Definition).name._M_string_length);
            }
            else {
              local_d8[0] = local_c8;
              pcVar5 = (local_128->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>((string *)local_d8,pcVar5,pcVar5 + sVar4);
              std::__cxx11::string::append((char *)local_d8);
              plVar7 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_d8,
                                          (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              psVar9 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_1d8.field_2._M_allocated_capacity = *psVar9;
                local_1d8.field_2._8_8_ = plVar7[3];
              }
              else {
                local_1d8.field_2._M_allocated_capacity = *psVar9;
                local_1d8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_1d8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar9;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
            }
            if ((sVar4 != 0) && (local_d8[0] != local_c8)) {
              operator_delete(local_d8[0],local_c8[0] + 1);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_190,"    const item = ",&local_1d8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1f8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1f8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_p != &aStack_180) {
              operator_delete(local_190._M_p,
                              CONCAT44(aStack_180._M_allocated_capacity._4_4_,
                                       CONCAT22(aStack_180._M_allocated_capacity._2_2_,
                                                aStack_180._M_allocated_capacity._0_2_)) + 1);
            }
            if ((((local_150->super_BaseGenerator).parser_)->opts).generate_object_based_api == true
               ) {
              (*(local_58->super_Namer)._vptr_Namer[0x11])
                        (&local_170,local_58,(pFVar2->value).type.struct_def);
              plVar7 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_170,0,(char *)0x0,0x3780ec);
              local_190._M_p = (pointer)&aStack_180;
              plVar10 = plVar7 + 2;
              if ((long *)*plVar7 == plVar10) {
                lVar6 = *plVar10;
                aStack_180._M_allocated_capacity._0_2_ = (undefined2)lVar6;
                aStack_180._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
                aStack_180._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
                aStack_180._8_2_ = (undefined2)plVar7[3];
                aStack_180._10_6_ = (undefined6)((ulong)plVar7[3] >> 0x10);
              }
              else {
                lVar6 = *plVar10;
                aStack_180._M_allocated_capacity._0_2_ = (undefined2)lVar6;
                aStack_180._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
                aStack_180._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
                local_190._M_p = (pointer)*plVar7;
              }
              uStack_188 = (undefined4)plVar7[1];
              uStack_184 = (undefined4)((ulong)plVar7[1] >> 0x20);
              *plVar7 = (long)plVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              psVar9 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar9) {
                local_1f8.field_2._M_allocated_capacity = *psVar9;
                local_1f8.field_2._8_8_ = plVar7[3];
              }
              else {
                local_1f8.field_2._M_allocated_capacity = *psVar9;
                local_1f8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_1f8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar9;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1f8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_p != &aStack_180) {
                operator_delete(local_190._M_p,
                                CONCAT44(aStack_180._M_allocated_capacity._4_4_,
                                         CONCAT22(aStack_180._M_allocated_capacity._2_2_,
                                                  aStack_180._M_allocated_capacity._0_2_)) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)local_1b8);
              std::__cxx11::string::append((char *)local_1b8);
              std::__cxx11::string::append((char *)local_1b8);
            }
            std::operator+(&local_1f8,"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (pFVar2->value).type.struct_def);
            local_148 = &local_138;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_148,local_1f8._M_dataplus._M_p,
                       local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
            std::__cxx11::string::append((char *)&local_148);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_148,(ulong)local_1f8._M_dataplus._M_p);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_170.field_2._M_allocated_capacity = *psVar9;
              local_170.field_2._8_8_ = plVar7[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar9;
              local_170._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_170._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_170);
            local_190._M_p = (pointer)&aStack_180;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              lVar6 = *plVar10;
              aStack_180._M_allocated_capacity._0_2_ = (undefined2)lVar6;
              aStack_180._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
              aStack_180._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
              aStack_180._8_2_ = (undefined2)plVar7[3];
              aStack_180._10_6_ = (undefined6)((ulong)plVar7[3] >> 0x10);
            }
            else {
              lVar6 = *plVar10;
              aStack_180._M_allocated_capacity._0_2_ = (undefined2)lVar6;
              aStack_180._M_allocated_capacity._2_2_ = (undefined2)((ulong)lVar6 >> 0x10);
              aStack_180._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar6 >> 0x20);
              local_190._M_p = (pointer)*plVar7;
            }
            uStack_188 = (undefined4)plVar7[1];
            uStack_184 = (undefined4)((ulong)plVar7[1] >> 0x20);
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,local_138 + 1);
            }
            pSVar3 = (pFVar2->value).type.struct_def;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"item","");
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,",\n    ","");
            GenStructMemberValueTS(&local_50,local_150,pSVar3,&local_98,&local_78,false);
            plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x36fc97);
            local_148 = &local_138;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_138 = *plVar10;
              lStack_130 = plVar7[3];
            }
            else {
              local_138 = *plVar10;
              local_148 = (long *)*plVar7;
            }
            local_140 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_170.field_2._M_allocated_capacity = *psVar9;
              local_170.field_2._8_8_ = plVar7[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar9;
              local_170._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_170._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_170._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,local_138 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            std::operator+(&local_170,"    ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_190);
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_170._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::append((char *)local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_p != &aStack_180) {
              operator_delete(local_190._M_p,
                              CONCAT44(aStack_180._M_allocated_capacity._4_4_,
                                       CONCAT22(aStack_180._M_allocated_capacity._2_2_,
                                                aStack_180._M_allocated_capacity._0_2_)) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            uVar13 = local_1b0.field_2._M_allocated_capacity;
            _Var14._M_p = local_1b0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) goto LAB_00264fd8;
            goto LAB_00264fe0;
          }
          NumToString<int>(&local_1b0,(pFVar2->value).type.fixed_length - 1);
          sVar4 = local_128->_M_string_length;
          if (sVar4 == 0) {
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d8,pcVar5,
                       pcVar5 + (pFVar2->super_Definition).name._M_string_length);
          }
          else {
            local_f8[0] = local_e8;
            pcVar5 = (local_128->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)local_f8,pcVar5,pcVar5 + sVar4);
            std::__cxx11::string::append((char *)local_f8);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_f8,
                                        (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1d8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
          }
          if ((sVar4 != 0) && (local_f8[0] != local_e8)) {
            operator_delete(local_f8[0],local_e8[0] + 1);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_190,"\n  for (let i = ",&local_1b0);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_1f8.field_2._M_allocated_capacity = *psVar9;
            local_1f8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar9;
            local_1f8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1f8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_p != &aStack_180) {
            operator_delete(local_190._M_p,
                            CONCAT44(aStack_180._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_180._M_allocated_capacity._2_2_,
                                              aStack_180._M_allocated_capacity._0_2_)) + 1);
          }
          std::__cxx11::string::append((char *)local_1b8);
          local_190._M_p._0_4_ = (pFVar2->value).type.element;
          local_190._M_p._4_4_ = BASE_TYPE_NONE;
          uStack_188 = 0;
          uStack_184 = 0;
          aStack_180._M_allocated_capacity._0_2_ = 0;
          aStack_180._M_allocated_capacity._2_2_ = 0;
          aStack_180._M_allocated_capacity._4_4_ = 0;
          aStack_180._8_2_ = 0;
          GenWriteMethod_abi_cxx11_(&local_1f8,local_150,(Type *)&local_190);
          std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)local_1b8);
          std::__cxx11::string::append((char *)local_1b8);
          if (BVar1 - BASE_TYPE_LONG < 2) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_190,"BigInt(",&local_1d8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1f8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1f8._M_dataplus._M_p);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_190,"(",&local_1d8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8.field_2._8_8_ = plVar7[3];
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar9;
              local_1f8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1f8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_190._M_p._4_4_,(BaseType)local_190._M_p) != &aStack_180) {
            operator_delete((void *)CONCAT44(local_190._M_p._4_4_,(BaseType)local_190._M_p),
                            CONCAT44(aStack_180._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_180._M_allocated_capacity._2_2_,
                                              aStack_180._M_allocated_capacity._0_2_)) + 1);
          }
          std::__cxx11::string::append((char *)local_1b8);
LAB_00264a9b:
          uVar13 = local_1d8.field_2._M_allocated_capacity;
          _Var14._M_p = local_1d8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) goto LAB_00264aaa;
        }
        else {
          sVar4 = local_128->_M_string_length;
          if (sVar4 == 0) {
            pcVar5 = (pFVar2->super_Definition).name._M_dataplus._M_p;
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,pcVar5,
                       pcVar5 + (pFVar2->super_Definition).name._M_string_length);
          }
          else {
            local_118[0] = local_108;
            pcVar5 = (local_128->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)local_118,pcVar5,pcVar5 + sVar4);
            std::__cxx11::string::append((char *)local_118);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)local_118,
                                (ulong)(pFVar2->super_Definition).name._M_dataplus._M_p);
            psVar9 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1b0.field_2._M_allocated_capacity = *psVar9;
              local_1b0.field_2._8_8_ = puVar8[3];
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            }
            else {
              local_1b0.field_2._M_allocated_capacity = *psVar9;
              local_1b0._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_1b0._M_string_length = puVar8[1];
            *puVar8 = psVar9;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
          }
          if ((sVar4 != 0) && (local_118[0] != local_108)) {
            operator_delete(local_118[0],local_108[0] + 1);
          }
          GenWriteMethod_abi_cxx11_((string *)&local_190,local_150,&(pFVar2->value).type);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x378170);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_1f8.field_2._M_allocated_capacity = *psVar9;
            local_1f8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar9;
            local_1f8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1f8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          psVar9 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_1d8.field_2._M_allocated_capacity = *psVar9;
            local_1d8.field_2._8_8_ = plVar7[3];
            local_1d8._M_dataplus._M_p = (pointer)paVar12;
          }
          else {
            local_1d8.field_2._M_allocated_capacity = *psVar9;
            local_1d8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1d8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar12) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_p != &aStack_180) {
            operator_delete(local_190._M_p,
                            CONCAT44(aStack_180._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_180._M_allocated_capacity._2_2_,
                                              aStack_180._M_allocated_capacity._0_2_)) + 1);
          }
          BVar1 = (pFVar2->value).type.base_type;
          if (BVar1 - BASE_TYPE_LONG < 2) {
            std::operator+(&local_1f8,"BigInt(",&local_1b0);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8.field_2._8_8_ = plVar7[3];
              local_1d8._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1d8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1d8._M_dataplus._M_p);
          }
          else {
            if (BVar1 != BASE_TYPE_BOOL) {
              local_1d8._M_dataplus._M_p = (pointer)paVar12;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,local_1b0._M_dataplus._M_p,
                         local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
              std::__cxx11::string::append((char *)&local_1d8);
              std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1d8._M_dataplus._M_p);
              goto LAB_00264a9b;
            }
            std::operator+(&local_1f8,"Number(Boolean(",&local_1b0);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
            psVar9 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8.field_2._8_8_ = plVar7[3];
              local_1d8._M_dataplus._M_p = (pointer)paVar12;
            }
            else {
              local_1d8.field_2._M_allocated_capacity = *psVar9;
              local_1d8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1d8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_1d8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != paVar12) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          uVar13 = local_1f8.field_2._M_allocated_capacity;
          _Var14._M_p = local_1f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
LAB_00264aaa:
            operator_delete(_Var14._M_p,uVar13 + 1);
          }
        }
        uVar13 = local_1b0.field_2._M_allocated_capacity;
        _Var14._M_p = local_1b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) goto LAB_00264fd8;
      }
LAB_00264fe0:
      ppFVar11 = ppFVar11 + -1;
    } while (ppFVar11 !=
             (local_120->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, std::string *body,
                     const std::string &nameprefix) {
    *body += "  builder.prep(";
    *body += NumToString(struct_def.minalign) + ", ";
    *body += NumToString(struct_def.bytesize) + ");\n";

    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding) {
        *body += "  builder.pad(" + NumToString(field.padding) + ");\n";
      }
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructBody(
            *field.value.type.struct_def, body,
            nameprefix.length() ? nameprefix + "_" + field.name : field.name);
      } else {
        auto element_type = field.value.type.element;

        if (field.value.type.base_type == BASE_TYPE_ARRAY) {
          switch (field.value.type.element) {
            case BASE_TYPE_STRUCT: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i" + ") {\n";

              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "    const item = " + fname + "?.[i];\n\n";

              if (parser_.opts.generate_object_based_api) {
                *body += "    if (item instanceof " +
                         GetTypeName(*field.value.type.struct_def,
                                     /*object_api =*/true) +
                         ") {\n";
                *body += "      item.pack(builder);\n";
                *body += "      continue;\n";
                *body += "    }\n\n";
              }

              std::string class_name =
                  GetPrefixedName(*field.value.type.struct_def);
              std::string pack_func_create_call =
                  class_name + ".create" + class_name + "(builder,\n";
              pack_func_create_call +=
                  "    " +
                  GenStructMemberValueTS(*field.value.type.struct_def, "item",
                                         ",\n    ", false) +
                  "\n  ";
              *body += "    " + pack_func_create_call;
              *body += "  );\n  }\n\n";

              break;
            }
            default: {
              std::string str_last_item_idx =
                  NumToString(field.value.type.fixed_length - 1);
              std::string fname = nameprefix.length()
                                      ? nameprefix + "_" + field.name
                                      : field.name;

              *body += "\n  for (let i = " + str_last_item_idx +
                       "; i >= 0; --i) {\n";
              *body += "    builder.write";
              *body += GenWriteMethod(
                  static_cast<flatbuffers::Type>(field.value.type.element));
              *body += "(";
              *body += element_type == BASE_TYPE_BOOL ? "+" : "";

              if (element_type == BASE_TYPE_LONG ||
                  element_type == BASE_TYPE_ULONG) {
                *body += "BigInt(" + fname + "?.[i] ?? 0));\n";
              } else {
                *body += "(" + fname + "?.[i] ?? 0));\n\n";
              }
              *body += "  }\n\n";
              break;
            }
          }
        } else {
          std::string fname =
              nameprefix.length() ? nameprefix + "_" + field.name : field.name;

          *body += "  builder.write" + GenWriteMethod(field.value.type) + "(";
          if (field.value.type.base_type == BASE_TYPE_BOOL) {
            *body += "Number(Boolean(" + fname + ")));\n";
            continue;
          } else if (field.value.type.base_type == BASE_TYPE_LONG ||
                     field.value.type.base_type == BASE_TYPE_ULONG) {
            *body += "BigInt(" + fname + " ?? 0));\n";
            continue;
          }

          *body += fname + ");\n";
        }
      }
    }
  }